

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmemory.c
# Opt level: O0

int_t zmemory_usage(int_t nzlmax,int_t nzumax,int_t nzlumax,int n)

{
  int dword;
  int liword;
  int iword;
  int n_local;
  int_t nzlumax_local;
  int_t nzumax_local;
  int_t nzlmax_local;
  
  return n * 0x28 + nzlmax * 4 + nzumax * 0x14 + nzlumax * 0x10;
}

Assistant:

int_t zmemory_usage(const int_t nzlmax, const int_t nzumax,
		  const int_t nzlumax, const int n)
{
    register int iword, liword, dword;

    iword   = sizeof(int);
    liword  = sizeof(int_t);
    dword   = sizeof(doublecomplex);
    
    return (10 * n * iword +
	    nzlmax * liword + nzumax * (liword + dword) + nzlumax * dword);

}